

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerMSL::constant_op_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,SPIRConstantOp *cop)

{
  uint *puVar1;
  char (*in_R8) [2];
  string local_40;
  SPIRConstantOp *local_20;
  SPIRConstantOp *cop_local;
  CompilerMSL *this_local;
  
  local_20 = cop;
  cop_local = (SPIRConstantOp *)this;
  this_local = (CompilerMSL *)__return_storage_ptr__;
  if (*(int *)&(cop->super_IVariant).field_0xc == 0x74) {
    add_spv_func_and_recompile(this,SPVFuncImplQuantizeToF16);
    puVar1 = VectorView<unsigned_int>::operator[]
                       (&(local_20->arguments).super_VectorView<unsigned_int>,0);
    CompilerGLSL::to_expression_abi_cxx11_(&local_40,&this->super_CompilerGLSL,*puVar1,true);
    join<char_const(&)[18],std::__cxx11::string,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)"spvQuantizeToF16(",(char (*) [18])&local_40,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5b7d4b,in_R8);
    ::std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    CompilerGLSL::constant_op_expression_abi_cxx11_
              (__return_storage_ptr__,&this->super_CompilerGLSL,cop);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::constant_op_expression(const SPIRConstantOp &cop)
{
	switch (cop.opcode)
	{
	case OpQuantizeToF16:
		add_spv_func_and_recompile(SPVFuncImplQuantizeToF16);
		return join("spvQuantizeToF16(", to_expression(cop.arguments[0]), ")");
	default:
		return CompilerGLSL::constant_op_expression(cop);
	}
}